

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Multiband.cpp
# Opt level: O1

int Multiband::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  undefined8 uVar1;
  UnityAudioParameterDefinition *pUVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  int i;
  char **ppcVar7;
  
  pUVar2 = (UnityAudioParameterDefinition *)operator_new__(0x640);
  definition->paramdefs = pUVar2;
  RegisterParameter(definition,"MasterGain","dB",-100.0,100.0,0.0,1.0,1.0,0,"Overall gain");
  RegisterParameter(definition,"LowFreq","Hz",0.01,24000.0,800.0,1.0,3.0,1,
                    "Low/Mid cross-over frequency");
  RegisterParameter(definition,"HighFreq","Hz",0.01,24000.0,5000.0,1.0,3.0,2,
                    "Mid/High cross-over frequency");
  iVar5 = 3;
  ppcVar7 = InternalRegisterEffectDefinition::bandname;
  lVar6 = 0;
  do {
    uVar1 = *(undefined8 *)((long)InternalRegisterEffectDefinition::bandname + lVar6);
    pcVar3 = tmpstr(0,"%sGain",uVar1);
    pcVar4 = tmpstr(1,"%s band gain in dB",uVar1);
    RegisterParameter(definition,pcVar3,"dB",-100.0,100.0,0.0,1.0,1.0,iVar5,pcVar4);
    iVar5 = iVar5 + 1;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x18);
  iVar5 = 6;
  lVar6 = 0;
  do {
    uVar1 = *(undefined8 *)((long)InternalRegisterEffectDefinition::bandname + lVar6);
    pcVar3 = tmpstr(0,"%sAttackTime",uVar1);
    pcVar4 = tmpstr(1,"%s band attack time in seconds",uVar1);
    RegisterParameter(definition,pcVar3,"ms",0.0,10.0,0.1,1000.0,4.0,iVar5,pcVar4);
    iVar5 = iVar5 + 1;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x18);
  iVar5 = 9;
  lVar6 = 0;
  do {
    uVar1 = *(undefined8 *)((long)InternalRegisterEffectDefinition::bandname + lVar6);
    pcVar3 = tmpstr(0,"%sReleaseTime",uVar1);
    pcVar4 = tmpstr(1,"%s band release time in seconds",uVar1);
    RegisterParameter(definition,pcVar3,"ms",0.0,10.0,0.5,1000.0,4.0,iVar5,pcVar4);
    iVar5 = iVar5 + 1;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x18);
  lVar6 = 0;
  do {
    pcVar3 = *ppcVar7;
    pcVar4 = tmpstr(0,"%sThreshold",pcVar3);
    pcVar3 = tmpstr(1,"%s band compression level threshold time in dB",pcVar3);
    RegisterParameter(definition,pcVar4,"dB",-50.0,0.0,-10.0,1.0,1.0,(uint)lVar6 | 0xc,pcVar3);
    lVar6 = lVar6 + 1;
    ppcVar7 = ppcVar7 + 1;
  } while (lVar6 != 3);
  iVar5 = 0xf;
  lVar6 = 0;
  do {
    uVar1 = *(undefined8 *)((long)InternalRegisterEffectDefinition::bandname + lVar6);
    pcVar3 = tmpstr(0,"%sRatio",uVar1);
    pcVar4 = tmpstr(1,"%s band compression ratio time in percent",uVar1);
    RegisterParameter(definition,pcVar3,"%",1.0,30.0,1.0,100.0,1.0,iVar5,pcVar4);
    iVar5 = iVar5 + 1;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x18);
  iVar5 = 0x12;
  lVar6 = 0;
  do {
    uVar1 = *(undefined8 *)((long)InternalRegisterEffectDefinition::bandname + lVar6);
    pcVar3 = tmpstr(0,"%sKnee",uVar1);
    pcVar4 = tmpstr(1,"%s band compression curve knee range in dB",uVar1);
    RegisterParameter(definition,pcVar3,"dB",0.0,40.0,10.0,1.0,1.0,iVar5,pcVar4);
    iVar5 = iVar5 + 1;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x18);
  RegisterParameter(definition,"FilterOrder","",1.0,4.0,1.0,1.0,1.0,0x15,
                    "Filter order of cross-over filters");
  RegisterParameter(definition,"UseLogScale","",0.0,1.0,1.0,1.0,1.0,0x16,
                    "Use logarithmic scale for plotting the filter curve frequency response and input/output spectra"
                   );
  RegisterParameter(definition,"ShowSpectrum","",0.0,1.0,0.0,1.0,1.0,0x17,
                    "Overlay input spectrum (green) and output spectrum (red)");
  RegisterParameter(definition,"SpectrumDecay","dB/s",-50.0,0.0,-10.0,1.0,1.0,0x18,
                    "Hold time for overlaid spectra");
  return 0x19;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        static const char* bandname[] = { "Low", "Mid", "High" };
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "MasterGain", "dB", -100.0f, 100.0f, 0.0f, 1.0f, 1.0f, P_MasterGain, "Overall gain");
        RegisterParameter(definition, "LowFreq", "Hz", 0.01f, 24000.0f, 800.0f, 1.0f, 3.0f, P_LowFreq, "Low/Mid cross-over frequency");
        RegisterParameter(definition, "HighFreq", "Hz", 0.01f, 24000.0f, 5000.0f, 1.0f, 3.0f, P_HighFreq, "Mid/High cross-over frequency");
        for (int i = 0; i < 3; i++)
            RegisterParameter(definition, tmpstr(0, "%sGain", bandname[i]), "dB", -100.0f, 100.0f, 0.0f, 1.0f, 1.0f, P_LowGain + i, tmpstr(1, "%s band gain in dB", bandname[i]));
        for (int i = 0; i < 3; i++)
            RegisterParameter(definition, tmpstr(0, "%sAttackTime", bandname[i]), "ms", 0.0f, 10.0f, 0.1f, 1000.0f, 4.0f, P_LowAttack + i, tmpstr(1, "%s band attack time in seconds", bandname[i]));
        for (int i = 0; i < 3; i++)
            RegisterParameter(definition, tmpstr(0, "%sReleaseTime", bandname[i]), "ms", 0.0f, 10.0f, 0.5f, 1000.0f, 4.0f, P_LowRelease + i, tmpstr(1, "%s band release time in seconds", bandname[i]));
        for (int i = 0; i < 3; i++)
            RegisterParameter(definition, tmpstr(0, "%sThreshold", bandname[i]), "dB", -50.0f, 0.0f, -10.0f, 1.0f, 1.0f, P_LowThreshold + i, tmpstr(1, "%s band compression level threshold time in dB", bandname[i]));
        for (int i = 0; i < 3; i++)
            RegisterParameter(definition, tmpstr(0, "%sRatio", bandname[i]), "%", 1.0f, 30.0f, 1.0f, 100.0f, 1.0f, P_LowRatio + i, tmpstr(1, "%s band compression ratio time in percent", bandname[i]));
        for (int i = 0; i < 3; i++)
            RegisterParameter(definition, tmpstr(0, "%sKnee", bandname[i]), "dB", 0.0f, 40.0f, 10.0f, 1.0f, 1.0f, P_LowKnee + i, tmpstr(1, "%s band compression curve knee range in dB", bandname[i]));
        RegisterParameter(definition, "FilterOrder", "", 1.0f, (float)MAXORDER, 1.0f, 1.0f, 1.0f, P_FilterOrder, "Filter order of cross-over filters");
        RegisterParameter(definition, "UseLogScale", "", 0.0f, 1.0f, 1.0f, 1.0f, 1.0f, P_UseLogScale, "Use logarithmic scale for plotting the filter curve frequency response and input/output spectra");
        RegisterParameter(definition, "ShowSpectrum", "", 0.0f, 1.0f, 0.0f, 1.0f, 1.0f, P_ShowSpectrum, "Overlay input spectrum (green) and output spectrum (red)");
        RegisterParameter(definition, "SpectrumDecay", "dB/s", -50.0f, 0.0f, -10.0f, 1.0f, 1.0f, P_SpectrumDecay, "Hold time for overlaid spectra");
        return numparams;
    }